

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

void __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::RTPHashTable(RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
               *this,RTPMemoryManager *mgr,int memtype)

{
  int local_20;
  int i;
  int memtype_local;
  RTPMemoryManager *mgr_local;
  RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
  *this_local;
  
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPHashTable_001923d0;
  for (local_20 = 0; local_20 < 0x207d; local_20 = local_20 + 1) {
    this->table[local_20] = (HashElement *)0x0;
  }
  this->firsthashelem = (HashElement *)0x0;
  this->lasthashelem = (HashElement *)0x0;
  this->memorytype = memtype;
  return;
}

Assistant:

inline RTPHashTable<Element,GetIndex,hashsize>::RTPHashTable(RTPMemoryManager *mgr,int memtype) : RTPMemoryObject(mgr)
{
	JRTPLIB_UNUSED(memtype); // possibly unused

	for (int i = 0 ; i < hashsize ; i++)
		table[i] = 0;
	firsthashelem = 0;
	lasthashelem = 0;
#ifdef RTP_SUPPORT_MEMORYMANAGEMENT
	memorytype = memtype;
#endif // RTP_SUPPORT_MEMORYMANAGEMENT
}